

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inlining.cpp
# Opt level: O0

Function * __thiscall
wasm::anon_unknown_225::FunctionSplitter::copyFunction
          (FunctionSplitter *this,Function *func,string *prefix)

{
  Module *module;
  string *this_00;
  Function *pFVar1;
  char *in_R8;
  Name newName;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string_view local_60;
  string_view local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *prefix_local;
  Function *func_local;
  FunctionSplitter *this_local;
  
  local_20 = prefix;
  prefix_local = (string *)func;
  func_local = (Function *)this;
  std::operator+(&local_40,"byn-split-",prefix);
  std::__cxx11::string::operator=((string *)prefix,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  this_00 = prefix_local;
  module = this->module;
  std::operator+(&local_a0,prefix,'$');
  IString::toString_abi_cxx11_(&local_c0,(IString *)prefix_local);
  std::operator+(&local_80,&local_a0,&local_c0);
  wasm::Name::Name((Name *)&local_60,&local_80);
  local_50 = (string_view)Names::getValidFunctionName(module,(Name)local_60);
  newName.super_IString.str._M_str = in_R8;
  newName.super_IString.str._M_len = (size_t)local_50._M_str;
  pFVar1 = wasm::ModuleUtils::copyFunction
                     ((ModuleUtils *)this_00,(Function *)module,(Module *)local_50._M_len,newName);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  return pFVar1;
}

Assistant:

Function* copyFunction(Function* func, std::string prefix) {
    // TODO: We copy quite a lot more than we need here, and throw stuff out.
    //       It is simple to just copy the entire thing to get the params and
    //       results and all that, but we could be more efficient.
    prefix = "byn-split-" + prefix;
    return ModuleUtils::copyFunction(
      func,
      *module,
      Names::getValidFunctionName(*module,
                                  prefix + '$' + func->name.toString()));
  }